

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_transaction.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_transaction_AddMultisigSignConfidentialTxSimple_Test::TestBody
          (cfdcapi_elements_transaction_AddMultisigSignConfidentialTxSimple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  bool in_stack_000000c7;
  char *in_stack_000000c8;
  int in_stack_000000d0;
  uint32_t in_stack_000000d4;
  char *in_stack_000000d8;
  char *in_stack_000000e0;
  void *in_stack_000000e8;
  char *in_stack_00000100;
  int64_t in_stack_00000108;
  char *in_stack_00000110;
  int in_stack_00000118;
  char **in_stack_00000128;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  char *str_buffer;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  char *tx_string;
  char *signature;
  int64_t satoshi;
  char *sighash;
  AssertionResult gtest_ar_1;
  void *multisign_handle;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  uint32_t in_stack_000004f4;
  char *in_stack_000004f8;
  char *in_stack_00000500;
  int in_stack_0000050c;
  void *in_stack_00000510;
  void *in_stack_00000518;
  int in_stack_00000530;
  char *in_stack_00000538;
  char **in_stack_00000540;
  bool *in_stack_fffffffffffffbb8;
  AssertionResult *in_stack_fffffffffffffbc0;
  char **in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbd0;
  undefined4 in_stack_fffffffffffffbd4;
  undefined4 in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbdc;
  undefined7 in_stack_fffffffffffffbf8;
  undefined1 in_stack_fffffffffffffbff;
  void *in_stack_fffffffffffffc20;
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  AssertionResult *in_stack_fffffffffffffc50;
  undefined7 in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc5f;
  undefined7 in_stack_fffffffffffffc70;
  undefined1 in_stack_fffffffffffffc77;
  void *in_stack_fffffffffffffc78;
  AssertHelper local_2b8;
  Message local_2b0;
  undefined4 local_2a4;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd68;
  undefined1 in_stack_fffffffffffffd73;
  int in_stack_fffffffffffffd74;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffd88;
  AssertHelper local_270;
  Message local_268;
  undefined4 local_25c;
  AssertionResult local_258;
  char *local_248;
  AssertHelper local_240;
  Message local_238;
  undefined4 local_22c;
  AssertionResult local_228;
  AssertHelper local_218;
  Message local_210;
  AssertionResult local_208;
  AssertHelper local_1f8;
  Message local_1f0;
  undefined4 local_1e4;
  AssertionResult local_1e0;
  AssertHelper local_1d0;
  Message local_1c8;
  undefined4 local_1bc;
  AssertionResult local_1b8;
  AssertHelper local_1a8;
  Message local_1a0;
  undefined4 local_194;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  undefined4 local_16c;
  AssertionResult local_168;
  undefined1 in_stack_fffffffffffffeab;
  int in_stack_fffffffffffffeac;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  char *in_stack_fffffffffffffec0;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffec8;
  AssertHelper local_130;
  Message local_128;
  char **in_stack_fffffffffffffee0;
  AssertHelper local_110;
  Message local_108;
  undefined4 local_fc;
  AssertionResult local_f8;
  char *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  char *local_d0;
  AssertHelper local_c8;
  Message local_c0;
  undefined4 local_b4;
  AssertionResult local_b0;
  undefined8 local_a0;
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x350fea);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x634,pcVar2);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x35104d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3510a2);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8,(type *)0x3510d6);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x635,pcVar2);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x3511d2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x35124d);
  local_a0 = 0;
  local_14 = CfdInitializeMultisigSign
                       (in_stack_fffffffffffffc78,
                        (void **)CONCAT17(in_stack_fffffffffffffc77,in_stack_fffffffffffffc70));
  local_b4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351322);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x639,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x351385);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3513dd);
  if (local_14 == 0) {
    local_d0 = (char *)0x0;
    local_d8 = 13000000000000;
    local_e0 = 0;
    local_e8 = (char *)0x0;
    in_stack_fffffffffffffbc0 = (AssertionResult *)0xbd2cc61d000;
    in_stack_fffffffffffffbd8 = 0;
    in_stack_fffffffffffffbd0 = 1;
    in_stack_fffffffffffffbc8 = (char **)0x0;
    local_14 = CfdCreateConfidentialSighash
                         (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d4,
                          in_stack_000000d0,in_stack_000000c8,in_stack_00000100,in_stack_00000108,
                          in_stack_00000110,in_stack_00000118,in_stack_000000c7,in_stack_00000128);
    local_fc = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f8);
    if (!bVar1) {
      testing::Message::Message(&local_108);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351536);
      testing::internal::AssertHelper::AssertHelper
                (&local_110,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x643,pcVar2);
      testing::internal::AssertHelper::operator=(&local_110,&local_108);
      testing::internal::AssertHelper::~AssertHelper(&local_110);
      testing::Message::~Message((Message *)0x351599);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3515ee);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&stack0xfffffffffffffee0,
                 "\"d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f\"","sighash",
                 "d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f",local_d0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffee0);
      if (!bVar1) {
        testing::Message::Message(&local_128);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x35169d);
        testing::internal::AssertHelper::AssertHelper
                  (&local_130,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x645,pcVar2);
        testing::internal::AssertHelper::operator=(&local_130,&local_128);
        testing::internal::AssertHelper::~AssertHelper(&local_130);
        testing::Message::~Message((Message *)0x351700);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x351758);
      local_14 = CfdCalculateEcSignature
                           (in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                            (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            (char *)in_stack_fffffffffffffeb0.ptr_,in_stack_fffffffffffffeac,
                            (bool)in_stack_fffffffffffffeab,in_stack_fffffffffffffee0);
      in_stack_fffffffffffffebc = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool
                        ((AssertionResult *)&stack0xfffffffffffffec0);
      if (!bVar1) {
        testing::Message::Message((Message *)&stack0xfffffffffffffeb0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351846);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffea8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x649,pcVar2);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffea8,(Message *)&stack0xfffffffffffffeb0);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffea8);
        testing::Message::~Message((Message *)0x3518a9);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x351901);
      if (local_14 == 0) {
        local_14 = CfdAddMultisigSignDataToDer
                             (in_stack_fffffffffffffd88.ptr_,in_stack_fffffffffffffd80,
                              (char *)in_stack_fffffffffffffd78.ptr_,in_stack_fffffffffffffd74,
                              (bool)in_stack_fffffffffffffd73,(char *)in_stack_fffffffffffffd68.ptr_
                             );
        local_16c = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
        if (!bVar1) {
          testing::Message::Message(&local_178);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3519ef);
          testing::internal::AssertHelper::AssertHelper
                    (&local_180,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x64d,pcVar2);
          testing::internal::AssertHelper::operator=(&local_180,&local_178);
          testing::internal::AssertHelper::~AssertHelper(&local_180);
          testing::Message::~Message((Message *)0x351a52);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x351aa7);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
      }
    }
    if (local_14 == 0) {
      local_14 = CfdCalculateEcSignature
                           (in_stack_fffffffffffffec8.ptr_,in_stack_fffffffffffffec0,
                            (char *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8),
                            (char *)in_stack_fffffffffffffeb0.ptr_,in_stack_fffffffffffffeac,
                            (bool)in_stack_fffffffffffffeab,in_stack_fffffffffffffee0);
      local_194 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
      if (!bVar1) {
        testing::Message::Message(&local_1a0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351bb4);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1a8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x655,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
        testing::internal::AssertHelper::~AssertHelper(&local_1a8);
        testing::Message::~Message((Message *)0x351c17);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x351c6f);
      if (local_14 == 0) {
        local_14 = CfdAddMultisigSignDataToDer
                             (in_stack_fffffffffffffd88.ptr_,in_stack_fffffffffffffd80,
                              (char *)in_stack_fffffffffffffd78.ptr_,in_stack_fffffffffffffd74,
                              (bool)in_stack_fffffffffffffd73,(char *)in_stack_fffffffffffffd68.ptr_
                             );
        local_1bc = 0;
        testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                  ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                   (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                   (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b8);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351d5d);
          testing::internal::AssertHelper::AssertHelper
                    (&local_1d0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x659,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1d0,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper(&local_1d0);
          testing::Message::~Message((Message *)0x351dc0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x351e15);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
      }
    }
    if (local_14 == 0) {
      in_stack_fffffffffffffbc8 = &local_e8;
      in_stack_fffffffffffffbc0 = (AssertionResult *)TestBody::multisig_script;
      local_14 = CfdFinalizeMultisigSign
                           (in_stack_00000518,in_stack_00000510,in_stack_0000050c,in_stack_00000500,
                            in_stack_000004f8,in_stack_000004f4,in_stack_00000530,in_stack_00000538,
                            in_stack_00000540);
      local_1e4 = 0;
      testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
                ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
                 (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                 (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e0);
      if (!bVar1) {
        testing::Message::Message(&local_1f0);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x351f33);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                   ,0x662,pcVar2);
        testing::internal::AssertHelper::operator=(&local_1f8,&local_1f0);
        testing::internal::AssertHelper::~AssertHelper(&local_1f8);
        testing::Message::~Message((Message *)0x351f96);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x351feb);
      if (local_14 == 0) {
        in_stack_fffffffffffffc50 = &local_208;
        testing::internal::CmpHelperSTREQ
                  ((internal *)in_stack_fffffffffffffc50,
                   "\"0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000\""
                   ,"tx_string",
                   "0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000"
                   ,local_e8);
        in_stack_fffffffffffffc5f =
             testing::AssertionResult::operator_cast_to_bool(in_stack_fffffffffffffc50);
        if (!(bool)in_stack_fffffffffffffc5f) {
          testing::Message::Message(&local_210);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x35209a);
          testing::internal::AssertHelper::AssertHelper
                    (&local_218,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                     ,0x664,pcVar2);
          testing::internal::AssertHelper::operator=(&local_218,&local_210);
          testing::internal::AssertHelper::~AssertHelper(&local_218);
          testing::Message::~Message((Message *)0x3520fd);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x352152);
        CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
      }
    }
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
    local_14 = CfdFreeMultisigSignHandle
                         ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                          in_stack_fffffffffffffc20);
    local_22c = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
    if (!bVar1) {
      testing::Message::Message(&local_238);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x352239);
      testing::internal::AssertHelper::AssertHelper
                (&local_240,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x66b,pcVar2);
      testing::internal::AssertHelper::operator=(&local_240,&local_238);
      testing::internal::AssertHelper::~AssertHelper(&local_240);
      testing::Message::~Message((Message *)0x352296);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3522eb);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffbff,
                                                  in_stack_fffffffffffffbf8));
  if (local_14 != 0) {
    local_248 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         ((void *)CONCAT17(in_stack_fffffffffffffc5f,in_stack_fffffffffffffc58),
                          (char **)in_stack_fffffffffffffc50);
    local_25c = 0;
    this_00 = &local_258;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
               (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
               (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
    if (!bVar1) {
      testing::Message::Message(&local_268);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3523d8);
      testing::internal::AssertHelper::AssertHelper
                (&local_270,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x672,pcVar2);
      testing::internal::AssertHelper::operator=(&local_270,&local_268);
      testing::internal::AssertHelper::~AssertHelper(&local_270);
      testing::Message::~Message((Message *)0x352435);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x35248a);
    testing::internal::CmpHelperSTREQ
              ((internal *)&stack0xfffffffffffffd80,"\"\"","str_buffer","",local_248);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffd80);
    if (!bVar1) {
      testing::Message::Message((Message *)&stack0xfffffffffffffd78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x35251f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffd70,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
                 ,0x673,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffd70,(Message *)&stack0xfffffffffffffd78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffd70);
      testing::Message::~Message((Message *)0x35257c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3525d1);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffbc8);
    local_248 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffbc8);
  local_2a4 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8),
             (char *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
             (CfdErrorCode *)in_stack_fffffffffffffbc8,(int *)in_stack_fffffffffffffbc0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd60);
  if (!bVar1) {
    testing::Message::Message(&local_2b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x3526a1);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/capi/test_cfdcapi_elements_transaction.cpp"
               ,0x679,pcVar2);
    testing::internal::AssertHelper::operator=(&local_2b8,&local_2b0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b8);
    testing::Message::~Message((Message *)0x3526fe);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x352753);
  return;
}

Assistant:

TEST(cfdcapi_elements_transaction, AddMultisigSignConfidentialTxSimple) {
  static const char* const kTxData = "0200000000020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570000000000ffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000";
  static const char* pubkey1 = "02715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad";
  static const char* privkey1 = "cRVLMWHogUo51WECRykTbeLNbm5c57iEpSegjdxco3oef6o5dbFi";
  static const char* pubkey2 = "02bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d71";
  static const char* privkey2 = "cQUTZ8VbWNYBEtrB7xwe41kqiKMQPRZshTvBHmkoJGaUfmS5pxzR";
  static const char* multisig_script = "522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae";

  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  void* multisign_handle = nullptr;
  ret = CfdInitializeMultisigSign(handle, &multisign_handle);
  EXPECT_EQ(kCfdSuccess, ret);

  if (ret == kCfdSuccess) {
    char* sighash = nullptr;
    int64_t satoshi = 13000000000000;
    char* signature = nullptr;
    char* tx_string = nullptr;
    ret = CfdCreateConfidentialSighash(
        handle, kTxData, "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
        kCfdP2shP2wsh, nullptr, multisig_script, satoshi, nullptr, kCfdSigHashAll, false, &sighash);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ("d17f091203341a0d1f0101c6d010a40ce0f3cef8a09b2b605b77bb6cfc23359f", sighash);

      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey1, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddMultisigSignDataToDer(
          handle, multisign_handle, signature, kCfdSigHashAll, false, pubkey1);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }

    if (ret == kCfdSuccess) {
      ret = CfdCalculateEcSignature(
        handle, sighash, nullptr, privkey2, kCfdNetworkRegtest, true, &signature);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        ret = CfdAddMultisigSignDataToDer(
          handle, multisign_handle, signature, kCfdSigHashAll, false, pubkey2);
        EXPECT_EQ(kCfdSuccess, ret);
        CfdFreeStringBuffer(signature);
      }
    }
    if (ret == kCfdSuccess) {
      ret = CfdFinalizeMultisigSign(
          handle, multisign_handle, kCfdNetworkElementsRegtest, kTxData,
          "57a15002d066ce52573d674df925c9bc0f1164849420705f2cfad8a68111230f", 0,
          kCfdP2shP2wsh, multisig_script, &tx_string);
      EXPECT_EQ(kCfdSuccess, ret);
      if (ret == kCfdSuccess) {
        EXPECT_STREQ("0200000001020f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a15700000000232200206e67741009d105674a17f86e73433030eea0603c020fb25ea08c6fadd6c2f62dffffffff0f231181a6d8fa2c5f7020948464110fbcc925f94d673d5752ce66d00250a1570100008000ffffffffd8bbe31bc590cbb6a47d2e53a956ec25d8890aefd60dcfc93efd34727554890b0683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000023c346000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b947f6002200d8510dfcf8e2330c0795c771d1e6064daab2f274ac32a6e2708df9bfa893d17a914ef3e40882e17d6e477082fcafeb0f09dc32d377b87010bad521bafdac767421d45b71b29a349c7b2ca2a06b5d8e3b5898c91df2769ed010000000029b9270002cc645552109331726c0ffadccab21620dd7a5a33260c6ac7bd1c78b98cb1e35a1976a9146c22e209d36612e0d9d2a20b814d7d8648cc7a7788ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000000000c350000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000023c3460003ce4c4eac09fe317f365e45c00ffcf2e9639bc0fd792c10f72cdc173c4e5ed8791976a9149bdcb18911fa9faad6632ca43b81739082b0a19588ac00000000000004004730440220795dbf165d3197fe27e2b73d57cacfb8d742029c972b109040c7785aee4e75ea022065f7a985efe82eba1d0e0cafd7cf711bb8c65485bddc4e495315dd92bd7e4a790147304402202ce4acde192e4109832d46970b510158d42fc156c92afff137157ebfc2a03e2a02200b7dfd3a92770d79d29b3c55fb6325b22bce0e1362de74b2dac80d9689b5a89b0147522102bfd7daa5d113fcbd8c2f374ae58cbb89cbed9570e898f1af5ff989457e2d4d712102715ed9a5f16153c5216a6751b7d84eba32076f0b607550a58b209077ab7c30ad52ae00000000000000000000000000", tx_string);
        CfdFreeStringBuffer(tx_string);
      }
    }
    CfdFreeStringBuffer(sighash);

    ret = CfdFreeMultisigSignHandle(handle, multisign_handle);
    EXPECT_EQ(kCfdSuccess, ret);
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}